

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O1

void __thiscall
cnn::Model::load<boost::archive::text_iarchive>(Model *this,text_iarchive *ar,uint param_2)

{
  pointer *pppPVar1;
  Parameters *pPVar2;
  LookupParameters *pLVar3;
  pointer ppPVar4;
  pointer ppPVar5;
  iterator iVar6;
  pointer ppLVar7;
  bool bVar8;
  pointer ppPVar9;
  pointer ppLVar10;
  ulong uVar11;
  ulong uVar12;
  void *x;
  int nlp;
  int np;
  Parameters *local_38;
  int local_30;
  int local_2c;
  
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_2c);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_30);
  if (local_2c !=
      (int)((ulong)((long)(this->params).
                          super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->params).
                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    __assert_fail("np == (int)params.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                  ,0x89,
                  "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
                 );
  }
  if (local_30 ==
      (int)((ulong)((long)(this->lookup_params).
                          super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->lookup_params).
                         super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    ppPVar9 = (this->params).
              super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppPVar9) {
      uVar11 = 0;
      uVar12 = 1;
      do {
        pPVar2 = ppPVar9[uVar11];
        boost::serialization::
        singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Parameters>_>
        ::get_instance();
        boost::archive::detail::basic_iarchive::load_object(ar,(basic_iserializer *)pPVar2);
        ppPVar9 = (this->params).
                  super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar8 = uVar12 < (ulong)((long)(this->params).
                                       super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar9 >>
                                3);
        uVar11 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar8);
    }
    ppLVar10 = (this->lookup_params).
               super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((this->lookup_params).
        super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppLVar10) {
      uVar11 = 0;
      uVar12 = 1;
      do {
        pLVar3 = ppLVar10[uVar11];
        boost::serialization::
        singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::LookupParameters>_>
        ::get_instance();
        boost::archive::detail::basic_iarchive::load_object(ar,(basic_iserializer *)pLVar3);
        ppLVar10 = (this->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        bVar8 = uVar12 < (ulong)((long)(this->lookup_params).
                                       super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar10
                                >> 3);
        uVar11 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar8);
    }
    ppPVar4 = (this->all_params).
              super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->all_params).
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppPVar4) {
      (this->all_params).
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppPVar4;
    }
    ppPVar5 = (this->params).
              super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppPVar9 = (this->params).
                   super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppPVar9 != ppPVar5; ppPVar9 = ppPVar9 + 1) {
      local_38 = *ppPVar9;
      iVar6._M_current =
           (this->all_params).
           super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->all_params).
          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
        _M_realloc_insert<cnn::ParametersBase*>
                  ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,iVar6,
                   (ParametersBase **)&local_38);
      }
      else {
        *iVar6._M_current = &local_38->super_ParametersBase;
        pppPVar1 = &(this->all_params).
                    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
    }
    ppLVar7 = (this->lookup_params).
              super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppLVar10 = (this->lookup_params).
                    super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppLVar10 != ppLVar7;
        ppLVar10 = ppLVar10 + 1) {
      local_38 = (Parameters *)*ppLVar10;
      iVar6._M_current =
           (this->all_params).
           super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->all_params).
          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
        _M_realloc_insert<cnn::ParametersBase*>
                  ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,iVar6,
                   (ParametersBase **)&local_38);
      }
      else {
        *iVar6._M_current = (ParametersBase *)local_38;
        pppPVar1 = &(this->all_params).
                    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
    }
    return;
  }
  __assert_fail("nlp == (int)lookup_params.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                ,0x8a,
                "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
               );
}

Assistant:

void load(Archive& ar, const unsigned int) {
    int np, nlp;
    ar & np;
    ar & nlp;
    assert(np == (int)params.size());
    assert(nlp == (int)lookup_params.size());
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
    all_params.clear();
    for (auto p : params) all_params.push_back(p);
    for (auto p : lookup_params) all_params.push_back(p);
  }